

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mqdec.c
# Opt level: O2

void jpc_mqdec_setctxs(jpc_mqdec_t *mqdec,int numctxs,jpc_mqctx_t *ctxs)

{
  int iVar1;
  jpc_mqstate_t **ppjVar2;
  int iVar3;
  int_fast16_t *piVar4;
  
  ppjVar2 = mqdec->ctxs;
  iVar1 = mqdec->maxctxs;
  iVar3 = iVar1 - numctxs;
  if (iVar1 < numctxs) {
    numctxs = iVar1;
  }
  piVar4 = &ctxs->ind;
  for (; 0 < numctxs; numctxs = numctxs + -1) {
    *ppjVar2 = (jpc_mqstate_t *)
               ((long)&jpc_mqstates[0].qeval +
               ((ulong)((jpc_mqctx_t *)(piVar4 + -1))->mps << 5 | *piVar4 << 6));
    ppjVar2 = ppjVar2 + 1;
    piVar4 = piVar4 + 2;
  }
  for (; 0 < iVar3; iVar3 = iVar3 + -1) {
    *ppjVar2 = jpc_mqstates;
    ppjVar2 = ppjVar2 + 1;
  }
  return;
}

Assistant:

void jpc_mqdec_setctxs(const jpc_mqdec_t *mqdec, int numctxs, const jpc_mqctx_t *ctxs)
{
	const jpc_mqstate_t **ctx;
	int n;

	ctx = mqdec->ctxs;
	n = JAS_MIN(mqdec->maxctxs, numctxs);
	while (--n >= 0) {
		*ctx = &jpc_mqstates[2 * ctxs->ind + ctxs->mps];
		++ctx;
		++ctxs;
	}
	n = mqdec->maxctxs - numctxs;
	while (--n >= 0) {
		*ctx = &jpc_mqstates[0];
		++ctx;
	}
}